

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

uint32_t predict_bandit_adf(warm_cb *data,multi_learner *base,example *ec)

{
  example *peVar1;
  size_t sVar2;
  uint32_t uVar3;
  int iVar4;
  vw_exception *this;
  uint32_t chosen_action;
  string local_208;
  score_iterator local_1e8;
  score_iterator local_1d8;
  _Vector_base<float,_std::allocator<float>_> local_1c8;
  stringstream __msg;
  ostream local_1a0;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_1c8,&data->cumulative_costs);
  uVar3 = find_min<float>((vector<float,_std::allocator<float>_> *)&local_1c8);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_1c8);
  copy_example_to_adf(data,ec);
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (base,&data->ecs,(ulong)uVar3);
  peVar1 = *(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar2 = data->example_counter;
  data->example_counter = sVar2 + 1;
  local_1d8._p = (action_score *)(peVar1->pred).scalars._begin;
  local_1d8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_1e8._p = (action_score *)(peVar1->pred).scalars._end;
  local_1e8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar4 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (sVar2 + data->app_seed,&local_1d8,&local_1e8,&chosen_action);
  if (iVar4 == 0) {
    copy_array<ACTION_SCORE::action_score>
              (&data->a_s_adf,(v_array<ACTION_SCORE::action_score> *)&(peVar1->pred).scalars);
    return chosen_action;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a0,"Failed to sample from pdf");
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/warm_cb.cc"
             ,0x19f,&local_208);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

uint32_t predict_bandit_adf(warm_cb& data, multi_learner& base, example& ec)
{
	uint32_t argmin = find_min(data.cumulative_costs);

  copy_example_to_adf(data, ec);
	base.predict(data.ecs, argmin);

	auto& out_ec = *data.ecs[0];
  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

	auto& a_s = data.a_s_adf;
	copy_array<action_score>(a_s, out_ec.pred.a_s);

	return chosen_action;
}